

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O0

int libssh2_agent_connect(LIBSSH2_AGENT *agent)

{
  int local_20;
  int local_1c;
  int rc;
  int i;
  LIBSSH2_AGENT *agent_local;
  
  local_20 = -1;
  local_1c = 0;
  while( true ) {
    if (supported_backends[local_1c].name == (char *)0x0) {
      return local_20;
    }
    agent->ops = supported_backends[local_1c].ops;
    local_20 = (*agent->ops->connect)(agent);
    if (local_20 == 0) break;
    local_1c = local_1c + 1;
  }
  return 0;
}

Assistant:

LIBSSH2_API int
libssh2_agent_connect(LIBSSH2_AGENT *agent)
{
    int i, rc = -1;
    for(i = 0; supported_backends[i].name; i++) {
        agent->ops = supported_backends[i].ops;
        rc = (agent->ops->connect)(agent);
        if(!rc)
            return 0;
    }
    return rc;
}